

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall
ElideMiddleNothingToElide::~ElideMiddleNothingToElide(ElideMiddleNothingToElide *this)

{
  ElideMiddleNothingToElide *this_local;
  
  ~ElideMiddleNothingToElide(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ElideMiddle, NothingToElide) {
  string input = "Nothing to elide in this short string.";
  EXPECT_EQ(input, ElideMiddle(input, 80));
  EXPECT_EQ(input, ElideMiddle(input, 38));
  EXPECT_EQ("", ElideMiddle(input, 0));
  EXPECT_EQ(".", ElideMiddle(input, 1));
  EXPECT_EQ("..", ElideMiddle(input, 2));
  EXPECT_EQ("...", ElideMiddle(input, 3));
}